

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkUniversal.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkUniversal::ConstraintsBiLoad_C
          (ChLinkUniversal *this,double factor,double recovery_clamp,bool do_clamp)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  double dVar11;
  undefined1 auVar12 [16];
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 != '\0') {
    dVar11 = factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array[0];
    dVar9 = factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[1];
    dVar7 = factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[2];
    dVar5 = factor * (this->m_C).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                     m_storage.m_data.array[3];
    if (do_clamp) {
      auVar2._8_8_ = in_XMM1_Qb;
      auVar2._0_8_ = recovery_clamp;
      auVar1._8_8_ = 0x8000000000000000;
      auVar1._0_8_ = 0x8000000000000000;
      auVar4 = vxorpd_avx512vl(auVar2,auVar1);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar11;
      auVar1 = vmaxsd_avx(auVar12,auVar4);
      auVar1 = vminsd_avx(auVar1,auVar2);
      dVar11 = auVar1._0_8_;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = dVar9;
      auVar1 = vmaxsd_avx(auVar10,auVar4);
      auVar1 = vminsd_avx(auVar1,auVar2);
      dVar9 = auVar1._0_8_;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar7;
      auVar1 = vmaxsd_avx(auVar8,auVar4);
      auVar1 = vminsd_avx(auVar1,auVar2);
      dVar7 = auVar1._0_8_;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = dVar5;
      auVar1 = vmaxsd_avx(auVar6,auVar4);
      auVar1 = vminsd_avx(auVar1,auVar2);
      dVar5 = auVar1._0_8_;
    }
    (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar11 + (this->m_cnstr_x).super_ChConstraintTwo.super_ChConstraint.b_i;
    (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar9 + (this->m_cnstr_y).super_ChConstraintTwo.super_ChConstraint.b_i;
    (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar7 + (this->m_cnstr_z).super_ChConstraintTwo.super_ChConstraint.b_i;
    (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i =
         dVar5 + (this->m_cnstr_dot).super_ChConstraintTwo.super_ChConstraint.b_i;
  }
  return;
}

Assistant:

void ChLinkUniversal::ConstraintsBiLoad_C(double factor, double recovery_clamp, bool do_clamp) {
    if (!IsActive())
        return;

    double cnstr_x_violation = factor * m_C(0);
    double cnstr_y_violation = factor * m_C(1);
    double cnstr_z_violation = factor * m_C(2);
    double cnstr_dot_violation = factor * m_C(3);

    if (do_clamp) {
        cnstr_x_violation = ChMin(ChMax(cnstr_x_violation, -recovery_clamp), recovery_clamp);
        cnstr_y_violation = ChMin(ChMax(cnstr_y_violation, -recovery_clamp), recovery_clamp);
        cnstr_z_violation = ChMin(ChMax(cnstr_z_violation, -recovery_clamp), recovery_clamp);
        cnstr_dot_violation = ChMin(ChMax(cnstr_dot_violation, -recovery_clamp), recovery_clamp);
    }

    m_cnstr_x.Set_b_i(m_cnstr_x.Get_b_i() + cnstr_x_violation);
    m_cnstr_y.Set_b_i(m_cnstr_y.Get_b_i() + cnstr_y_violation);
    m_cnstr_z.Set_b_i(m_cnstr_z.Get_b_i() + cnstr_z_violation);
    m_cnstr_dot.Set_b_i(m_cnstr_dot.Get_b_i() + cnstr_dot_violation);
}